

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.hpp
# Opt level: O2

void __thiscall
qclab::qgates::QControlledGate2<std::complex<double>_>::setQubits
          (QControlledGate2<std::complex<double>_> *this,int *qubits)

{
  int iVar1;
  uint __line;
  undefined8 in_RAX;
  undefined8 in_RDX;
  char *__assertion;
  
  iVar1 = *qubits;
  if (iVar1 < 0) {
    __assertion = "qubits[0] >= 0";
  }
  else {
    if (-1 < qubits[1]) {
      if (iVar1 != qubits[1]) {
        this->control_ = iVar1;
        (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>.
          _vptr_QObject[0x11])(this,(ulong)(uint)qubits[1],in_RDX,in_RAX);
        return;
      }
      __assertion = "qubits[0] != qubits[1]";
      __line = 0x3a;
      goto LAB_0010cd04;
    }
    __assertion = "qubits[1] >= 0";
  }
  __line = 0x39;
LAB_0010cd04:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QControlledGate2.hpp"
                ,__line,
                "virtual void qclab::qgates::QControlledGate2<std::complex<double>>::setQubits(const int *) [T = std::complex<double>]"
               );
}

Assistant:

inline void setQubits( const int* qubits ) override {
          assert( qubits[0] >= 0 ) ; assert( qubits[1] >= 0 ) ;
          assert( qubits[0] != qubits[1] ) ;
          control_ = qubits[0] ;
          this->setTarget( qubits[1] ) ;
        }